

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy_preset.c
# Opt level: O2

_Bool lzma_easy_preset(lzma_options_easy *opt_easy,uint32_t preset)

{
  lzma_bool lVar1;
  
  lVar1 = lzma_lzma_preset(&opt_easy->opt_lzma,preset);
  if (lVar1 == '\0') {
    opt_easy->filters[0].id = 0x21;
    opt_easy->filters[0].options = &opt_easy->opt_lzma;
    opt_easy->filters[1].id = 0xffffffffffffffff;
  }
  return lVar1 != '\0';
}

Assistant:

extern bool
lzma_easy_preset(lzma_options_easy *opt_easy, uint32_t preset)
{
	if (lzma_lzma_preset(&opt_easy->opt_lzma, preset))
		return true;

	opt_easy->filters[0].id = LZMA_FILTER_LZMA2;
	opt_easy->filters[0].options = &opt_easy->opt_lzma;
	opt_easy->filters[1].id = LZMA_VLI_UNKNOWN;

	return false;
}